

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O3

void Diligent::HashCombine<float,unsigned_int,unsigned_int,float,float,float,float,float,float>
               (size_t *Seed,float *FirstArg,uint *RestArgs,uint *RestArgs_1,float *RestArgs_2,
               float *RestArgs_3,float *RestArgs_4,float *RestArgs_5,float *RestArgs_6,
               float *RestArgs_7)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = ((uint)((int)*FirstArg * 0x1001) >> 0x16 ^ (int)*FirstArg * 0x1001) * 0x11;
  uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
  uVar1 = *Seed;
  *Seed = (uVar1 >> 2) + uVar1 * 0x40 + 0x9e3779b9 + (ulong)((uVar2 >> 2 ^ uVar2) * 0x81081) ^ uVar1
  ;
  HashCombine<unsigned_int,unsigned_int,float,float,float,float,float,float>
            (Seed,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void HashCombine(std::size_t& Seed, const FirstArgType& FirstArg, const RestArgsType&... RestArgs) noexcept
{
    HashCombine(Seed, FirstArg);
    HashCombine(Seed, RestArgs...); // recursive call using pack expansion syntax
}